

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

int nghttp2_bufs_wrap_init2(nghttp2_bufs *bufs,nghttp2_vec *vec,size_t veclen,nghttp2_mem *mem)

{
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  nghttp2_buf_chain *pnVar7;
  nghttp2_buf_chain *pnVar8;
  size_t *psVar9;
  undefined1 auVar10 [16];
  nghttp2_buf_chain *head_chain;
  nghttp2_buf_chain *local_28;
  
  if (veclen != 0) {
    local_28 = (nghttp2_buf_chain *)nghttp2_mem_malloc(mem,veclen * 0x30);
    if (local_28 == (nghttp2_buf_chain *)0x0) {
      iVar3 = -0x385;
    }
    else {
      psVar9 = &vec->len;
      lVar4 = 0;
      lVar6 = 0;
      sVar5 = veclen;
      pnVar7 = (nghttp2_buf_chain *)&stack0xffffffffffffffd8;
      do {
        *(undefined8 *)((long)&local_28->next + lVar4) = 0;
        puVar1 = ((nghttp2_vec *)(psVar9 + -1))->base;
        sVar2 = *psVar9;
        *(uint8_t **)((long)&(local_28->buf).mark + lVar4) = puVar1;
        auVar10._8_4_ = (int)puVar1;
        auVar10._0_8_ = puVar1;
        auVar10._12_4_ = (int)((ulong)puVar1 >> 0x20);
        *(undefined1 (*) [16])((long)&(local_28->buf).pos + lVar4) = auVar10;
        *(undefined1 (*) [16])((long)&(local_28->buf).begin + lVar4) = auVar10;
        if (sVar2 != 0) {
          *(uint8_t **)((long)&(local_28->buf).end + lVar4) = puVar1 + sVar2;
        }
        pnVar8 = local_28 + lVar6;
        pnVar7->next = (nghttp2_buf_chain *)((long)&local_28->next + lVar4);
        lVar6 = lVar6 + 1;
        psVar9 = psVar9 + 2;
        lVar4 = lVar4 + 0x30;
        sVar5 = sVar5 - 1;
        pnVar7 = pnVar8;
      } while (sVar5 != 0);
      bufs->mem = mem;
      iVar3 = 0;
      bufs->offset = 0;
      bufs->head = local_28;
      bufs->cur = local_28;
      bufs->chunk_length = 0;
      bufs->chunk_used = veclen;
      bufs->max_chunk = veclen;
      bufs->chunk_keep = veclen;
    }
    return iVar3;
  }
  iVar3 = nghttp2_bufs_wrap_init(bufs,(uint8_t *)0x0,0,mem);
  return iVar3;
}

Assistant:

int nghttp2_bufs_wrap_init2(nghttp2_bufs *bufs, const nghttp2_vec *vec,
                            size_t veclen, nghttp2_mem *mem) {
  size_t i = 0;
  nghttp2_buf_chain *cur_chain;
  nghttp2_buf_chain *head_chain;
  nghttp2_buf_chain **dst_chain = &head_chain;

  if (veclen == 0) {
    return nghttp2_bufs_wrap_init(bufs, NULL, 0, mem);
  }

  head_chain = nghttp2_mem_malloc(mem, sizeof(nghttp2_buf_chain) * veclen);
  if (head_chain == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  for (i = 0; i < veclen; ++i) {
    cur_chain = &head_chain[i];
    cur_chain->next = NULL;
    nghttp2_buf_wrap_init(&cur_chain->buf, vec[i].base, vec[i].len);

    *dst_chain = cur_chain;
    dst_chain = &cur_chain->next;
  }

  bufs->mem = mem;
  bufs->offset = 0;

  bufs->head = head_chain;
  bufs->cur = bufs->head;

  /* We don't use chunk_length since no allocation is expected. */
  bufs->chunk_length = 0;
  bufs->chunk_used = veclen;
  bufs->max_chunk = veclen;
  bufs->chunk_keep = veclen;

  return 0;
}